

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

kp_error_t
kp_storage_decrypt(kp_ctx *ctx,kp_storage_header *header,uchar *packed_header,
                  unsigned_long_long header_size,uchar *plain,unsigned_long_long *plain_size,
                  uchar *cipher,unsigned_long_long cipher_size)

{
  undefined8 uVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  uchar key [32];
  kp_error_t local_2c;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(undefined8 *)(in_RDI + 0x110c8);
  sVar3 = strlen(*(char **)(in_RDI + 0x110c8));
  iVar2 = crypto_pwhash_scryptsalsa208sha256
                    (local_28,0x20,uVar1,sVar3,in_RSI + 0x18,*(undefined8 *)(in_RSI + 8),
                     *(undefined8 *)(in_RSI + 0x10));
  if (iVar2 == 0) {
    iVar2 = crypto_aead_chacha20poly1305_decrypt
                      (in_R8,in_R9,0,in_stack_00000008,in_stack_00000010,in_RDX,in_RCX,in_RSI + 0x38
                       ,local_28);
    if (iVar2 == 0) {
      local_2c = 0;
    }
    else {
      local_2c = 7;
    }
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = 0xc;
    local_2c = 5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

static kp_error_t
kp_storage_decrypt(struct kp_ctx *ctx, struct kp_storage_header *header,
                   const unsigned char *packed_header,
                   unsigned long long header_size, unsigned char *plain,
                   unsigned long long *plain_size, const unsigned char *cipher,
                   unsigned long long cipher_size)
{
	unsigned char key[crypto_aead_chacha20poly1305_KEYBYTES];

	if (crypto_pwhash_scryptsalsa208sha256(key,
	                                       crypto_aead_chacha20poly1305_KEYBYTES,
	                                       ctx->password,
	                                       strlen(ctx->password),
	                                       header->salt, header->opslimit,
	                                       header->memlimit) != 0) {
		errno = ENOMEM;
		return KP_ERRNO;
	}

	if (crypto_aead_chacha20poly1305_decrypt(plain, plain_size,
	                                         NULL, cipher, cipher_size,
	                                         packed_header, header_size,
	                                         header->nonce, key) != 0) {
		return KP_EDECRYPT;
	}

	return KP_SUCCESS;
}